

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O3

void __thiscall slang::ast::EvalContext::pushEmptyFrame(EvalContext *this)

{
  Frame local_58;
  
  local_58.temporaries._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58.temporaries._M_t._M_impl.super__Rb_tree_header._M_header;
  local_58.temporaries._M_t._M_impl._0_8_ = 0;
  local_58.temporaries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58.temporaries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_58.temporaries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58.temporaries._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58.subroutine = (SubroutineSymbol *)0x0;
  local_58.callLocation = (SourceLocation)0x0;
  local_58.lookupLocation.scope = (Scope *)0x0;
  local_58.lookupLocation.index = 0;
  local_58.lookupLocation._12_4_ = 0;
  local_58.temporaries._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58.temporaries._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  SmallVectorBase<slang::ast::EvalContext::Frame>::emplace_back<slang::ast::EvalContext::Frame>
            (&(this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>,&local_58);
  std::
  _Rb_tree<const_slang::ast::ValueSymbol_*,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>,_std::_Select1st<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
  ::~_Rb_tree((_Rb_tree<const_slang::ast::ValueSymbol_*,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>,_std::_Select1st<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
               *)&local_58);
  return;
}

Assistant:

void EvalContext::pushEmptyFrame() {
    stack.emplace_back(Frame{});
}